

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1ba3de::cURLProgressHelper::UpdatePercentage
          (cURLProgressHelper *this,double value,double total,string *status)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  string local_1b0 [32];
  ostringstream oss;
  
  if (0.0 < total) {
    iVar1 = this->CurrentPercentage;
    iVar3 = (int)((value / total) * 100.0 + 0.5);
    iVar4 = 100;
    if (iVar3 < 100) {
      iVar4 = iVar3;
    }
    this->CurrentPercentage = iVar4;
    if (iVar1 != iVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"[");
      poVar2 = std::operator<<(poVar2,(string *)&this->Text);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->CurrentPercentage);
      std::operator<<(poVar2,"% complete]");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)status,local_1b0);
      std::__cxx11::string::~string(local_1b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
      return true;
    }
  }
  return false;
}

Assistant:

bool UpdatePercentage(double value, double total, std::string &status)
      {
      int OldPercentage = this->CurrentPercentage;

      if (total > 0.0)
        {
        this->CurrentPercentage = static_cast<int>(value/total*100.0 + 0.5);
        if(this->CurrentPercentage > 100)
          {
          // Avoid extra progress reports for unexpected data beyond total.
          this->CurrentPercentage = 100;
          }
        }

      bool updated = (OldPercentage != this->CurrentPercentage);

      if (updated)
        {
        std::ostringstream oss;
        oss << "[" << this->Text << " " << this->CurrentPercentage
            << "% complete]";
        status = oss.str();
        }

      return updated;
      }